

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModuleSource.cpp
# Opt level: O0

string * __thiscall
PerModuleInterface::GetOSCanonicalCleanPath_abi_cxx11_
          (string *__return_storage_ptr__,PerModuleInterface *this,char *compilePath_,
          char *filename_)

{
  Path local_f8;
  Path local_d0;
  Path local_a8;
  Path local_80;
  undefined1 local_48 [8];
  Path path;
  char *filename__local;
  char *compilePath__local;
  
  path.m_string.field_2._8_8_ = compilePath_;
  FileSystemUtils::Path::Path((Path *)local_48);
  FileSystemUtils::Path::operator=((Path *)local_48,(char *)this);
  FileSystemUtils::Path::Path(&local_a8,(char *)path.m_string.field_2._8_8_);
  FileSystemUtils::operator/(&local_80,(Path *)local_48,&local_a8);
  FileSystemUtils::Path::operator=((Path *)local_48,&local_80);
  FileSystemUtils::Path::~Path(&local_80);
  FileSystemUtils::Path::~Path(&local_a8);
  FileSystemUtils::Path::DelimitersToOSDefault(&local_d0,(Path *)local_48);
  FileSystemUtils::Path::operator=((Path *)local_48,&local_d0);
  FileSystemUtils::Path::~Path(&local_d0);
  FileSystemUtils::Path::GetCleanPath(&local_f8,(Path *)local_48);
  FileSystemUtils::Path::operator=((Path *)local_48,&local_f8);
  FileSystemUtils::Path::~Path(&local_f8);
  FileSystemUtils::Path::ToOSCanonicalCase((Path *)local_48);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&path);
  FileSystemUtils::Path::~Path((Path *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string PerModuleInterface::GetOSCanonicalCleanPath( const char* compilePath_, const char* filename_ )
{
	FileSystemUtils::Path path;
	path = compilePath_;
	path = path / filename_;
	path = path.DelimitersToOSDefault();
	path = path.GetCleanPath();
	path.ToOSCanonicalCase();
	return path.m_string;
}